

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct8x8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  __m128i *palVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  byte bVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  uint uVar15;
  int iVar18;
  int iVar20;
  undefined1 auVar16 [16];
  uint uVar19;
  uint uVar21;
  int iVar22;
  uint uVar23;
  undefined1 auVar17 [16];
  int iVar24;
  int iVar28;
  int iVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar30;
  int iVar31;
  int iVar34;
  int iVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar36;
  int iVar37;
  int iVar39;
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar48;
  int iVar49;
  undefined1 in_XMM12 [16];
  undefined1 auVar47 [16];
  int iVar50;
  int iVar51;
  uint uVar52;
  int iVar55;
  int iVar57;
  undefined1 auVar53 [16];
  uint uVar56;
  uint uVar58;
  int iVar59;
  uint uVar60;
  undefined1 auVar54 [16];
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  uint uVar67;
  int iVar69;
  int iVar70;
  uint uVar71;
  int iVar72;
  int iVar73;
  uint uVar74;
  undefined1 auVar68 [16];
  int iVar75;
  int iVar76;
  uint uVar77;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  iVar10 = do_cols + 6 + (uint)(bit == 0) * 2;
  iVar8 = 0x8000;
  if (0xf < iVar10) {
    iVar8 = 1 << ((char)iVar10 - 1U & 0x1f);
  }
  iVar10 = -iVar8;
  iVar8 = iVar8 + -1;
  lVar11 = 0;
  auVar47 = pmovsxwd(in_XMM12,0x800080008000800);
  bVar6 = true;
  do {
    bVar9 = bVar6;
    auVar5._8_4_ = 799;
    auVar5._0_8_ = 0x31f0000031f;
    auVar5._12_4_ = 799;
    auVar32 = pmulld((undefined1  [16])in[lVar11 + 2],auVar5);
    auVar53._8_4_ = 0xfffff04f;
    auVar53._0_8_ = 0xfffff04ffffff04f;
    auVar53._12_4_ = 0xfffff04f;
    auVar16 = pmulld((undefined1  [16])in[lVar11 + 0xe],auVar53);
    auVar33._8_4_ = 0xfb1;
    auVar33._0_8_ = 0xfb100000fb1;
    auVar33._12_4_ = 0xfb1;
    auVar25 = pmulld((undefined1  [16])in[lVar11 + 2],auVar33);
    auVar53 = pmulld((undefined1  [16])in[lVar11 + 0xe],auVar5);
    auVar12._8_4_ = 0xd4e;
    auVar12._0_8_ = 0xd4e00000d4e;
    auVar12._12_4_ = 0xd4e;
    auVar26 = pmulld((undefined1  [16])in[lVar11 + 10],auVar12);
    auVar4._8_4_ = 0xfffff71c;
    auVar4._0_8_ = 0xfffff71cfffff71c;
    auVar4._12_4_ = 0xfffff71c;
    auVar33 = pmulld((undefined1  [16])in[lVar11 + 6],auVar4);
    auVar38._8_4_ = 0x8e4;
    auVar38._0_8_ = 0x8e4000008e4;
    auVar38._12_4_ = 0x8e4;
    auVar12 = pmulld((undefined1  [16])in[lVar11 + 10],auVar38);
    auVar13._8_4_ = 0xd4e;
    auVar13._0_8_ = 0xd4e00000d4e;
    auVar13._12_4_ = 0xd4e;
    auVar38 = pmulld((undefined1  [16])in[lVar11 + 6],auVar13);
    auVar68._8_4_ = 0xb50;
    auVar68._0_8_ = 0xb5000000b50;
    auVar68._12_4_ = 0xb50;
    auVar68 = pmulld((undefined1  [16])in[lVar11],auVar68);
    auVar27._8_4_ = 0xb50;
    auVar27._0_8_ = 0xb5000000b50;
    auVar27._12_4_ = 0xb50;
    auVar13 = pmulld((undefined1  [16])in[lVar11 + 8],auVar27);
    iVar46 = auVar47._0_4_;
    iVar65 = auVar68._0_4_ + iVar46;
    iVar48 = auVar47._4_4_;
    iVar69 = auVar68._4_4_ + iVar48;
    iVar49 = auVar47._8_4_;
    iVar72 = auVar68._8_4_ + iVar49;
    iVar50 = auVar47._12_4_;
    iVar75 = auVar68._12_4_ + iVar50;
    auVar2._8_4_ = 0x61f;
    auVar2._0_8_ = 0x61f0000061f;
    auVar2._12_4_ = 0x61f;
    auVar68 = pmulld((undefined1  [16])in[lVar11 + 4],auVar2);
    auVar3._8_4_ = 0xfffff138;
    auVar3._0_8_ = 0xfffff138fffff138;
    auVar3._12_4_ = 0xfffff138;
    auVar27 = pmulld((undefined1  [16])in[lVar11 + 0xc],auVar3);
    iVar14 = auVar16._0_4_ + auVar32._0_4_ + iVar46 >> 0xc;
    iVar18 = auVar16._4_4_ + auVar32._4_4_ + iVar48 >> 0xc;
    iVar20 = auVar16._8_4_ + auVar32._8_4_ + iVar49 >> 0xc;
    iVar22 = auVar16._12_4_ + auVar32._12_4_ + iVar50 >> 0xc;
    iVar51 = auVar53._0_4_ + auVar25._0_4_ + iVar46 >> 0xc;
    iVar55 = auVar53._4_4_ + auVar25._4_4_ + iVar48 >> 0xc;
    iVar57 = auVar53._8_4_ + auVar25._8_4_ + iVar49 >> 0xc;
    iVar59 = auVar53._12_4_ + auVar25._12_4_ + iVar50 >> 0xc;
    iVar31 = auVar33._0_4_ + auVar26._0_4_ + iVar46 >> 0xc;
    iVar34 = auVar33._4_4_ + auVar26._4_4_ + iVar48 >> 0xc;
    iVar35 = auVar33._8_4_ + auVar26._8_4_ + iVar49 >> 0xc;
    iVar36 = auVar33._12_4_ + auVar26._12_4_ + iVar50 >> 0xc;
    iVar37 = auVar38._0_4_ + auVar12._0_4_ + iVar46 >> 0xc;
    iVar39 = auVar38._4_4_ + auVar12._4_4_ + iVar48 >> 0xc;
    iVar40 = auVar38._8_4_ + auVar12._8_4_ + iVar49 >> 0xc;
    iVar41 = auVar38._12_4_ + auVar12._12_4_ + iVar50 >> 0xc;
    iVar61 = iVar65 + auVar13._0_4_ >> 0xc;
    iVar62 = iVar69 + auVar13._4_4_ >> 0xc;
    iVar63 = iVar72 + auVar13._8_4_ >> 0xc;
    iVar64 = iVar75 + auVar13._12_4_ >> 0xc;
    iVar66 = iVar65 - auVar13._0_4_ >> 0xc;
    iVar70 = iVar69 - auVar13._4_4_ >> 0xc;
    iVar73 = iVar72 - auVar13._8_4_ >> 0xc;
    iVar76 = iVar75 - auVar13._12_4_ >> 0xc;
    iVar24 = auVar27._0_4_ + auVar68._0_4_ + iVar46 >> 0xc;
    iVar28 = auVar27._4_4_ + auVar68._4_4_ + iVar48 >> 0xc;
    iVar29 = auVar27._8_4_ + auVar68._8_4_ + iVar49 >> 0xc;
    iVar30 = auVar27._12_4_ + auVar68._12_4_ + iVar50 >> 0xc;
    auVar32._8_4_ = 0xec8;
    auVar32._0_8_ = 0xec800000ec8;
    auVar32._12_4_ = 0xec8;
    auVar12 = pmulld((undefined1  [16])in[lVar11 + 4],auVar32);
    auVar26._8_4_ = 0x61f;
    auVar26._0_8_ = 0x61f0000061f;
    auVar26._12_4_ = 0x61f;
    auVar13 = pmulld((undefined1  [16])in[lVar11 + 0xc],auVar26);
    iVar42 = auVar13._0_4_ + auVar12._0_4_ + iVar46 >> 0xc;
    iVar43 = auVar13._4_4_ + auVar12._4_4_ + iVar48 >> 0xc;
    iVar44 = auVar13._8_4_ + auVar12._8_4_ + iVar49 >> 0xc;
    iVar45 = auVar13._12_4_ + auVar12._12_4_ + iVar50 >> 0xc;
    iVar65 = iVar31 + iVar14;
    iVar69 = iVar34 + iVar18;
    iVar72 = iVar35 + iVar20;
    iVar75 = iVar36 + iVar22;
    iVar14 = iVar14 - iVar31;
    iVar18 = iVar18 - iVar34;
    iVar20 = iVar20 - iVar35;
    iVar22 = iVar22 - iVar36;
    uVar15 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
    uVar19 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
    uVar21 = (uint)(iVar20 < iVar10) * iVar10 | (uint)(iVar20 >= iVar10) * iVar20;
    uVar23 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
    auVar17._0_4_ = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    auVar17._4_4_ = (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    auVar17._8_4_ = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    auVar17._12_4_ = (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    iVar14 = iVar37 + iVar51;
    iVar18 = iVar39 + iVar55;
    iVar20 = iVar40 + iVar57;
    iVar22 = iVar41 + iVar59;
    iVar51 = iVar51 - iVar37;
    iVar55 = iVar55 - iVar39;
    iVar57 = iVar57 - iVar40;
    iVar59 = iVar59 - iVar41;
    uVar15 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
    uVar19 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
    uVar21 = (uint)(iVar20 < iVar10) * iVar10 | (uint)(iVar20 >= iVar10) * iVar20;
    uVar23 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
    uVar15 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    uVar19 = (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    uVar21 = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    uVar23 = (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    uVar52 = (uint)(iVar51 < iVar10) * iVar10 | (uint)(iVar51 >= iVar10) * iVar51;
    uVar56 = (uint)(iVar55 < iVar10) * iVar10 | (uint)(iVar55 >= iVar10) * iVar55;
    uVar58 = (uint)(iVar57 < iVar10) * iVar10 | (uint)(iVar57 >= iVar10) * iVar57;
    uVar60 = (uint)(iVar59 < iVar10) * iVar10 | (uint)(iVar59 >= iVar10) * iVar59;
    auVar54._0_4_ = (uint)(iVar8 < (int)uVar52) * iVar8 | (iVar8 >= (int)uVar52) * uVar52;
    auVar54._4_4_ = (uint)(iVar8 < (int)uVar56) * iVar8 | (iVar8 >= (int)uVar56) * uVar56;
    auVar54._8_4_ = (uint)(iVar8 < (int)uVar58) * iVar8 | (iVar8 >= (int)uVar58) * uVar58;
    auVar54._12_4_ = (uint)(iVar8 < (int)uVar60) * iVar8 | (iVar8 >= (int)uVar60) * uVar60;
    iVar14 = iVar42 + iVar61;
    iVar18 = iVar43 + iVar62;
    iVar20 = iVar44 + iVar63;
    iVar22 = iVar45 + iVar64;
    iVar61 = iVar61 - iVar42;
    iVar62 = iVar62 - iVar43;
    iVar63 = iVar63 - iVar44;
    iVar64 = iVar64 - iVar45;
    uVar52 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
    uVar56 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
    uVar58 = (uint)(iVar20 < iVar10) * iVar10 | (uint)(iVar20 >= iVar10) * iVar20;
    uVar60 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
    uVar52 = (uint)(iVar8 < (int)uVar52) * iVar8 | (iVar8 >= (int)uVar52) * uVar52;
    uVar56 = (uint)(iVar8 < (int)uVar56) * iVar8 | (iVar8 >= (int)uVar56) * uVar56;
    uVar58 = (uint)(iVar8 < (int)uVar58) * iVar8 | (iVar8 >= (int)uVar58) * uVar58;
    uVar60 = (uint)(iVar8 < (int)uVar60) * iVar8 | (iVar8 >= (int)uVar60) * uVar60;
    iVar31 = iVar24 + iVar66;
    iVar34 = iVar28 + iVar70;
    iVar35 = iVar29 + iVar73;
    iVar36 = iVar30 + iVar76;
    iVar66 = iVar66 - iVar24;
    iVar70 = iVar70 - iVar28;
    iVar73 = iVar73 - iVar29;
    iVar76 = iVar76 - iVar30;
    auVar16._8_4_ = 0xb50;
    auVar16._0_8_ = 0xb5000000b50;
    auVar16._12_4_ = 0xb50;
    auVar12 = pmulld(auVar17,auVar16);
    auVar25._8_4_ = 0xb50;
    auVar25._0_8_ = 0xb5000000b50;
    auVar25._12_4_ = 0xb50;
    auVar13 = pmulld(auVar54,auVar25);
    iVar14 = uVar15 + uVar52;
    iVar18 = uVar19 + uVar56;
    iVar20 = uVar21 + uVar58;
    iVar22 = uVar23 + uVar60;
    iVar37 = uVar52 - uVar15;
    iVar39 = uVar56 - uVar19;
    iVar40 = uVar58 - uVar21;
    iVar41 = uVar60 - uVar23;
    uVar15 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
    uVar19 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
    uVar21 = (uint)(iVar20 < iVar10) * iVar10 | (uint)(iVar20 >= iVar10) * iVar20;
    uVar23 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
    palVar1 = out + lVar11;
    *(uint *)*palVar1 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    *(uint *)(*palVar1 + 1) = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    uVar15 = (uint)(iVar31 < iVar10) * iVar10 | (uint)(iVar31 >= iVar10) * iVar31;
    uVar19 = (uint)(iVar34 < iVar10) * iVar10 | (uint)(iVar34 >= iVar10) * iVar34;
    uVar21 = (uint)(iVar35 < iVar10) * iVar10 | (uint)(iVar35 >= iVar10) * iVar35;
    uVar23 = (uint)(iVar36 < iVar10) * iVar10 | (uint)(iVar36 >= iVar10) * iVar36;
    uVar15 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    uVar19 = (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    uVar21 = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    uVar23 = (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    iVar24 = auVar12._0_4_ + auVar13._0_4_ + iVar46 >> 0xc;
    iVar28 = auVar12._4_4_ + auVar13._4_4_ + iVar48 >> 0xc;
    iVar29 = auVar12._8_4_ + auVar13._8_4_ + iVar49 >> 0xc;
    iVar30 = auVar12._12_4_ + auVar13._12_4_ + iVar50 >> 0xc;
    uVar52 = (uint)(iVar37 < iVar10) * iVar10 | (uint)(iVar37 >= iVar10) * iVar37;
    uVar56 = (uint)(iVar39 < iVar10) * iVar10 | (uint)(iVar39 >= iVar10) * iVar39;
    uVar58 = (uint)(iVar40 < iVar10) * iVar10 | (uint)(iVar40 >= iVar10) * iVar40;
    uVar60 = (uint)(iVar41 < iVar10) * iVar10 | (uint)(iVar41 >= iVar10) * iVar41;
    palVar1 = out + lVar11 + 0xe;
    *(uint *)*palVar1 = (uint)(iVar8 < (int)uVar52) * iVar8 | (iVar8 >= (int)uVar52) * uVar52;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar8 < (int)uVar56) * iVar8 | (iVar8 >= (int)uVar56) * uVar56;
    *(uint *)(*palVar1 + 1) = (uint)(iVar8 < (int)uVar58) * iVar8 | (iVar8 >= (int)uVar58) * uVar58;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar8 < (int)uVar60) * iVar8 | (iVar8 >= (int)uVar60) * uVar60;
    iVar14 = iVar24 + uVar15;
    iVar18 = iVar28 + uVar19;
    iVar20 = iVar29 + uVar21;
    iVar22 = iVar30 + uVar23;
    iVar24 = uVar15 - iVar24;
    iVar28 = uVar19 - iVar28;
    iVar29 = uVar21 - iVar29;
    iVar30 = uVar23 - iVar30;
    uVar15 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
    uVar19 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
    uVar21 = (uint)(iVar20 < iVar10) * iVar10 | (uint)(iVar20 >= iVar10) * iVar20;
    uVar23 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
    palVar1 = out + lVar11 + 2;
    *(uint *)*palVar1 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    *(uint *)(*palVar1 + 1) = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    uVar15 = (uint)(iVar66 < iVar10) * iVar10 | (uint)(iVar66 >= iVar10) * iVar66;
    uVar19 = (uint)(iVar70 < iVar10) * iVar10 | (uint)(iVar70 >= iVar10) * iVar70;
    uVar21 = (uint)(iVar73 < iVar10) * iVar10 | (uint)(iVar73 >= iVar10) * iVar73;
    uVar23 = (uint)(iVar76 < iVar10) * iVar10 | (uint)(iVar76 >= iVar10) * iVar76;
    uVar52 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    uVar56 = (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    uVar58 = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    uVar60 = (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    iVar31 = (auVar13._0_4_ - auVar12._0_4_) + iVar46 >> 0xc;
    iVar34 = (auVar13._4_4_ - auVar12._4_4_) + iVar48 >> 0xc;
    iVar35 = (auVar13._8_4_ - auVar12._8_4_) + iVar49 >> 0xc;
    iVar36 = (auVar13._12_4_ - auVar12._12_4_) + iVar50 >> 0xc;
    uVar15 = (uint)(iVar24 < iVar10) * iVar10 | (uint)(iVar24 >= iVar10) * iVar24;
    uVar19 = (uint)(iVar28 < iVar10) * iVar10 | (uint)(iVar28 >= iVar10) * iVar28;
    uVar21 = (uint)(iVar29 < iVar10) * iVar10 | (uint)(iVar29 >= iVar10) * iVar29;
    uVar23 = (uint)(iVar30 < iVar10) * iVar10 | (uint)(iVar30 >= iVar10) * iVar30;
    palVar1 = out + lVar11 + 0xc;
    *(uint *)*palVar1 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    *(uint *)(*palVar1 + 1) = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    iVar14 = iVar31 + uVar52;
    iVar18 = iVar34 + uVar56;
    iVar20 = iVar35 + uVar58;
    iVar22 = iVar36 + uVar60;
    iVar31 = uVar52 - iVar31;
    iVar34 = uVar56 - iVar34;
    iVar35 = uVar58 - iVar35;
    iVar36 = uVar60 - iVar36;
    uVar15 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
    uVar19 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
    uVar21 = (uint)(iVar20 < iVar10) * iVar10 | (uint)(iVar20 >= iVar10) * iVar20;
    uVar23 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
    palVar1 = out + lVar11 + 4;
    *(uint *)*palVar1 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    *(uint *)(*palVar1 + 1) = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    uVar15 = (uint)(iVar65 < iVar10) * iVar10 | (uint)(iVar65 >= iVar10) * iVar65;
    uVar19 = (uint)(iVar69 < iVar10) * iVar10 | (uint)(iVar69 >= iVar10) * iVar69;
    uVar21 = (uint)(iVar72 < iVar10) * iVar10 | (uint)(iVar72 >= iVar10) * iVar72;
    uVar23 = (uint)(iVar75 < iVar10) * iVar10 | (uint)(iVar75 >= iVar10) * iVar75;
    uVar15 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    uVar19 = (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    uVar21 = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    uVar23 = (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    uVar52 = (uint)(iVar61 < iVar10) * iVar10 | (uint)(iVar61 >= iVar10) * iVar61;
    uVar56 = (uint)(iVar62 < iVar10) * iVar10 | (uint)(iVar62 >= iVar10) * iVar62;
    uVar58 = (uint)(iVar63 < iVar10) * iVar10 | (uint)(iVar63 >= iVar10) * iVar63;
    uVar60 = (uint)(iVar64 < iVar10) * iVar10 | (uint)(iVar64 >= iVar10) * iVar64;
    uVar52 = (uint)(iVar8 < (int)uVar52) * iVar8 | (iVar8 >= (int)uVar52) * uVar52;
    uVar56 = (uint)(iVar8 < (int)uVar56) * iVar8 | (iVar8 >= (int)uVar56) * uVar56;
    uVar58 = (uint)(iVar8 < (int)uVar58) * iVar8 | (iVar8 >= (int)uVar58) * uVar58;
    uVar60 = (uint)(iVar8 < (int)uVar60) * iVar8 | (iVar8 >= (int)uVar60) * uVar60;
    uVar67 = (uint)(iVar31 < iVar10) * iVar10 | (uint)(iVar31 >= iVar10) * iVar31;
    uVar71 = (uint)(iVar34 < iVar10) * iVar10 | (uint)(iVar34 >= iVar10) * iVar34;
    uVar74 = (uint)(iVar35 < iVar10) * iVar10 | (uint)(iVar35 >= iVar10) * iVar35;
    uVar77 = (uint)(iVar36 < iVar10) * iVar10 | (uint)(iVar36 >= iVar10) * iVar36;
    palVar1 = out + lVar11 + 10;
    *(uint *)*palVar1 = (uint)(iVar8 < (int)uVar67) * iVar8 | (iVar8 >= (int)uVar67) * uVar67;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar8 < (int)uVar71) * iVar8 | (iVar8 >= (int)uVar71) * uVar71;
    *(uint *)(*palVar1 + 1) = (uint)(iVar8 < (int)uVar74) * iVar8 | (iVar8 >= (int)uVar74) * uVar74;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar8 < (int)uVar77) * iVar8 | (iVar8 >= (int)uVar77) * uVar77;
    iVar14 = uVar15 + uVar52;
    iVar18 = uVar19 + uVar56;
    iVar20 = uVar21 + uVar58;
    iVar22 = uVar23 + uVar60;
    iVar65 = uVar52 - uVar15;
    iVar69 = uVar56 - uVar19;
    iVar72 = uVar58 - uVar21;
    iVar75 = uVar60 - uVar23;
    uVar15 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
    uVar19 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
    uVar21 = (uint)(iVar20 < iVar10) * iVar10 | (uint)(iVar20 >= iVar10) * iVar20;
    uVar23 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
    palVar1 = out + lVar11 + 6;
    *(uint *)*palVar1 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    *(uint *)(*palVar1 + 1) = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    uVar15 = (uint)(iVar65 < iVar10) * iVar10 | (uint)(iVar65 >= iVar10) * iVar65;
    uVar19 = (uint)(iVar69 < iVar10) * iVar10 | (uint)(iVar69 >= iVar10) * iVar69;
    uVar21 = (uint)(iVar72 < iVar10) * iVar10 | (uint)(iVar72 >= iVar10) * iVar72;
    uVar23 = (uint)(iVar75 < iVar10) * iVar10 | (uint)(iVar75 >= iVar10) * iVar75;
    palVar1 = out + lVar11 + 8;
    *(uint *)*palVar1 = (uint)(iVar8 < (int)uVar15) * iVar8 | (iVar8 >= (int)uVar15) * uVar15;
    *(uint *)((long)*palVar1 + 4) =
         (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
    *(uint *)(*palVar1 + 1) = (uint)(iVar8 < (int)uVar21) * iVar8 | (iVar8 >= (int)uVar21) * uVar21;
    *(uint *)((long)*palVar1 + 0xc) =
         (uint)(iVar8 < (int)uVar23) * iVar8 | (iVar8 >= (int)uVar23) * uVar23;
    lVar11 = 1;
    bVar6 = false;
  } while (bVar9);
  if (bit == 0) {
    bVar7 = 10;
    if (10 < do_cols) {
      bVar7 = (byte)do_cols;
    }
    local_48 = 0x20 << (bVar7 & 0x1f);
    local_38 = -local_48;
    local_48 = local_48 + -1;
    iStack_44 = local_48;
    iStack_40 = local_48;
    iStack_3c = local_48;
    iStack_34 = local_38;
    iStack_30 = local_38;
    iStack_2c = local_38;
    round_shift_8x8(out,bd);
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_38,(__m128i *)&local_48,0x10);
  }
  return;
}

Assistant:

static void idct8x8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                           int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x, y;
  int col;

  // Note:
  //  Even column: 0, 2, ..., 14
  //  Odd column: 1, 3, ..., 15
  //  one even column plus one odd column constructs one row (8 coeffs)
  //  total we have 8 rows (8x8).
  for (col = 0; col < 2; ++col) {
    // stage 0
    // stage 1
    // stage 2
    u0 = in[0 * 2 + col];
    u1 = in[4 * 2 + col];
    u2 = in[2 * 2 + col];
    u3 = in[6 * 2 + col];

    x = _mm_mullo_epi32(in[1 * 2 + col], cospi56);
    y = _mm_mullo_epi32(in[7 * 2 + col], cospim8);
    u4 = _mm_add_epi32(x, y);
    u4 = _mm_add_epi32(u4, rnding);
    u4 = _mm_srai_epi32(u4, bit);

    x = _mm_mullo_epi32(in[1 * 2 + col], cospi8);
    y = _mm_mullo_epi32(in[7 * 2 + col], cospi56);
    u7 = _mm_add_epi32(x, y);
    u7 = _mm_add_epi32(u7, rnding);
    u7 = _mm_srai_epi32(u7, bit);

    x = _mm_mullo_epi32(in[5 * 2 + col], cospi24);
    y = _mm_mullo_epi32(in[3 * 2 + col], cospim40);
    u5 = _mm_add_epi32(x, y);
    u5 = _mm_add_epi32(u5, rnding);
    u5 = _mm_srai_epi32(u5, bit);

    x = _mm_mullo_epi32(in[5 * 2 + col], cospi40);
    y = _mm_mullo_epi32(in[3 * 2 + col], cospi24);
    u6 = _mm_add_epi32(x, y);
    u6 = _mm_add_epi32(u6, rnding);
    u6 = _mm_srai_epi32(u6, bit);

    // stage 3
    x = _mm_mullo_epi32(u0, cospi32);
    y = _mm_mullo_epi32(u1, cospi32);
    v0 = _mm_add_epi32(x, y);
    v0 = _mm_add_epi32(v0, rnding);
    v0 = _mm_srai_epi32(v0, bit);

    v1 = _mm_sub_epi32(x, y);
    v1 = _mm_add_epi32(v1, rnding);
    v1 = _mm_srai_epi32(v1, bit);

    x = _mm_mullo_epi32(u2, cospi48);
    y = _mm_mullo_epi32(u3, cospim16);
    v2 = _mm_add_epi32(x, y);
    v2 = _mm_add_epi32(v2, rnding);
    v2 = _mm_srai_epi32(v2, bit);

    x = _mm_mullo_epi32(u2, cospi16);
    y = _mm_mullo_epi32(u3, cospi48);
    v3 = _mm_add_epi32(x, y);
    v3 = _mm_add_epi32(v3, rnding);
    v3 = _mm_srai_epi32(v3, bit);

    addsub_sse4_1(u4, u5, &v4, &v5, &clamp_lo, &clamp_hi);
    addsub_sse4_1(u7, u6, &v7, &v6, &clamp_lo, &clamp_hi);

    // stage 4
    addsub_sse4_1(v0, v3, &u0, &u3, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v1, v2, &u1, &u2, &clamp_lo, &clamp_hi);
    u4 = v4;
    u7 = v7;

    x = _mm_mullo_epi32(v5, cospi32);
    y = _mm_mullo_epi32(v6, cospi32);
    u6 = _mm_add_epi32(y, x);
    u6 = _mm_add_epi32(u6, rnding);
    u6 = _mm_srai_epi32(u6, bit);

    u5 = _mm_sub_epi32(y, x);
    u5 = _mm_add_epi32(u5, rnding);
    u5 = _mm_srai_epi32(u5, bit);

    // stage 5
    addsub_sse4_1(u0, u7, out + 0 * 2 + col, out + 7 * 2 + col, &clamp_lo,
                  &clamp_hi);
    addsub_sse4_1(u1, u6, out + 1 * 2 + col, out + 6 * 2 + col, &clamp_lo,
                  &clamp_hi);
    addsub_sse4_1(u2, u5, out + 2 * 2 + col, out + 5 * 2 + col, &clamp_lo,
                  &clamp_hi);
    addsub_sse4_1(u3, u4, out + 3 * 2 + col, out + 4 * 2 + col, &clamp_lo,
                  &clamp_hi);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
  }
}